

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall
SAT::explainToExhaustion
          (SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  char *pcVar1;
  Reason *pRVar2;
  Reason RVar3;
  Clause *pCVar4;
  Lit *pLVar5;
  int *__ptr;
  uint uVar6;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  ostream *poVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint n;
  bool bVar14;
  Lit q;
  vec<int> old_out_learnt_level;
  vec<Lit> old_out_learnt;
  Lit local_b0;
  uint local_ac;
  string local_a8;
  vec<int> local_88;
  vec<Lit> local_78;
  char *local_60;
  vec<Lit> *local_58;
  ulong local_50;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_48;
  ulong local_40;
  vec<int> *local_38;
  undefined4 extraout_var;
  
  uVar13 = (ulong)(this->seen).sz;
  local_48 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             contributingNogoods;
  local_60 = (char *)malloc(uVar13);
  if (uVar13 != 0) {
    pcVar1 = (this->seen).data;
    uVar11 = 0;
    do {
      local_60[uVar11] = pcVar1[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  local_58 = &this->out_learnt;
  local_50 = uVar13;
  vec<Lit>::vec<Lit>(&local_78,local_58);
  local_38 = &this->out_learnt_level;
  vec<int>::vec<int>(&local_88,local_38);
  if ((this->out_learnt).sz != 0) {
    uVar6 = 0;
    do {
      pRVar2 = (this->reason).data;
      local_40 = (ulong)uVar6;
      uVar12 = (this->out_learnt).data[local_40].x;
      n = uVar12 ^ 1;
      uVar12 = (int)uVar12 >> 1;
      aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar2[uVar12].field_0._pt;
      uVar9 = aVar7._0_4_ & 3;
      local_ac = uVar6;
      if ((aVar7._a & 3) != 0) {
        if (uVar9 == 1) {
          btToPos(this,this->index,(this->trailpos).data[uVar12]);
          RVar3.field_0 =
               (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar12].field_0._a;
          aVar7._0_4_ = (*engine.propagators.data[(ulong)RVar3.field_0 >> 0x20]->_vptr_Propagator[5]
                        )(engine.propagators.data[(ulong)RVar3.field_0 >> 0x20],(ulong)n,
                          (ulong)RVar3.field_0 >> 2 & 0x3fffffff);
          aVar7._a._4_4_ = extraout_var;
        }
        else {
          pCVar4 = this->short_expl;
          *(uint *)pCVar4 = uVar9 << 8 | (uint)*(byte *)pCVar4;
          if (((ulong)aVar7 & 3) == 0 || uVar9 == 1) {
LAB_001c5bab:
            abort();
          }
          *(uint *)(pCVar4 + 1) = *(uint *)&pRVar2[uVar12].field_0 >> 2;
          if (uVar9 == 3) {
            pCVar4[1].data[0].x = *(int *)((long)&pRVar2[uVar12].field_0 + 4);
          }
          aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
        }
      }
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"checking literal ",0x11);
        getLitString_abi_cxx11_(&local_a8,n);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,
                            (char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                             (int)local_a8._M_dataplus._M_p),
                            local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
        }
      }
      if (aVar7._pt == (Clause *)0x0) {
        if (so.debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"it has no reason\n",0x11);
        }
        uVar6 = local_ac + 1;
      }
      else {
        if ((*(uint *)aVar7._pt & 1) != 0) {
          uVar6 = *(uint *)aVar7._pt >> 8;
          aVar7._pt[1].data[(ulong)uVar6 - 1].x = aVar7._pt[1].data[(ulong)uVar6 - 1].x + 1;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(local_48,&aVar7._pt[1].data[uVar6].x);
        }
        pLVar5 = (this->out_learnt).data;
        pLVar5[local_40].x = pLVar5[(this->out_learnt).sz - 1].x;
        (this->out_learnt).sz = (this->out_learnt).sz - 1;
        (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
        uVar6 = local_ac;
        if (0x1ff < *(uint *)aVar7._pt) {
          uVar13 = 1;
          do {
            if (*(uint *)aVar7._pt >> 8 <= uVar13) goto LAB_001c5bab;
            local_b0.x = (aVar7._pt)->data[uVar13].x;
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"adding literal ",0xf);
              getLitString_abi_cxx11_(&local_a8,local_b0.x);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         (char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                          (int)local_a8._M_dataplus._M_p),local_a8._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
                  &local_a8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         (int)local_a8._M_dataplus._M_p));
              }
            }
            pcVar1 = (this->seen).data;
            if (pcVar1[(uint)(local_b0.x >> 1)] == '\0') {
              pcVar1[(uint)(local_b0.x >> 1)] = '\x01';
              vec<Lit>::push(local_58,&local_b0);
              uVar11 = (ulong)engine.trail_lim.sz;
              iVar10 = engine.trail_lim.sz + 1;
              do {
                bVar14 = uVar11 == 0;
                uVar11 = uVar11 - 1;
                if (bVar14) {
                  iVar10 = 0;
                  break;
                }
                iVar10 = iVar10 + -1;
              } while ((this->trailpos).data[(uint)(local_b0.x >> 1)] <
                       engine.trail_lim.data[uVar11]);
              local_a8._M_dataplus._M_p._0_4_ = iVar10 + -1;
              if (iVar10 == 0) {
                local_a8._M_dataplus._M_p._0_4_ = 0;
              }
              vec<int>::push(local_38,(int *)&local_a8);
            }
            else if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," but already seen it",0x14);
            }
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
            }
            uVar13 = uVar13 + 1;
            uVar6 = local_ac;
          } while (uVar13 < *(uint *)aVar7._pt >> 8);
        }
      }
    } while (uVar6 < local_58->sz);
  }
  pcVar1 = (this->seen).data;
  if (pcVar1 != (char *)0x0) {
    (this->seen).sz = 0;
    (this->seen).cap = 0;
    free(pcVar1);
    (this->seen).data = (char *)0x0;
  }
  (this->seen).data = local_60;
  (this->seen).sz = (uint)local_50;
  (this->seen).cap = (uint)local_50;
  pLVar5 = (this->out_learnt).data;
  if (pLVar5 != (Lit *)0x0) {
    (this->out_learnt).sz = 0;
    (this->out_learnt).cap = 0;
    free(pLVar5);
    (this->out_learnt).data = (Lit *)0x0;
  }
  (this->out_learnt).data = local_78.data;
  (this->out_learnt).sz = local_78.sz;
  (this->out_learnt).cap = local_78.cap;
  local_78.sz = 0;
  local_78.cap = 0;
  local_78.data = (Lit *)0x0;
  __ptr = (this->out_learnt_level).data;
  if (__ptr != (int *)0x0) {
    (this->out_learnt_level).sz = 0;
    (this->out_learnt_level).cap = 0;
    free(__ptr);
    (this->out_learnt_level).data = (int *)0x0;
  }
  (this->out_learnt_level).data = local_88.data;
  (this->out_learnt_level).sz = local_88.sz;
  (this->out_learnt_level).cap = local_88.cap;
  local_88.data = (int *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  if (local_78.data != (Lit *)0x0) {
    free(local_78.data);
  }
  return;
}

Assistant:

void SAT::explainToExhaustion(std::set<int>& contributingNogoods) {
	vec<char> oldseen(seen);
	vec<Lit> old_out_learnt(out_learnt);
	vec<int> old_out_learnt_level(out_learnt_level);

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		assert(!reason[var(p)].isLazy());
		Clause* cp = getExpl(~p);
		if (so.debug) {
			std::cerr << "checking literal " << getLitString(toInt(~p)) << "\n";
		}
		if (cp == nullptr) {
			if (so.debug) {
				std::cerr << "it has no reason\n";
			}
			continue;
		}
		Clause& c = *cp;
		if (c.learnt) {
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (so.debug) {
				std::cerr << "adding literal " << getLitString(toInt(q));
			}
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			} else {
				if (so.debug) {
					std::cerr << " but already seen it";
				}
			}
			if (so.debug) {
				std::cerr << "\n";
			}
		}
	}

	oldseen.moveTo(seen);
	old_out_learnt.moveTo(out_learnt);
	old_out_learnt_level.moveTo(out_learnt_level);
}